

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_123::AsyncPipe::writeWithFds
          (AsyncPipe *this,ArrayPtr<const_unsigned_char> data,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData,ArrayPtr<const_int> fds)

{
  AsyncCapabilityStream *pAVar1;
  _func_int **pp_Var2;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces;
  long lVar3;
  void *pvVar4;
  ArrayPtr<const_unsigned_char> *pAVar5;
  uchar *puVar6;
  size_t *psVar7;
  size_t *psVar8;
  long in_R9;
  bool bVar9;
  bool bVar10;
  ArrayPtr<const_unsigned_char> writeBuffer;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault local_60;
  undefined1 local_58 [16];
  char *pcStack_48;
  undefined8 local_40;
  bool local_38;
  
  psVar7 = (size_t *)moreData.size_;
  pAVar5 = moreData.ptr;
  puVar6 = (uchar *)data.size_;
  bVar9 = pAVar5 != (ArrayPtr<const_unsigned_char> *)0x0;
  lVar3 = in_R9;
  if (in_R9 != 0 && !bVar9) {
    do {
      psVar8 = psVar7;
      pAVar5 = (ArrayPtr<const_unsigned_char> *)psVar8[1];
      psVar7 = psVar8 + 2;
      in_R9 = lVar3 + -1;
      bVar9 = pAVar5 != (ArrayPtr<const_unsigned_char> *)0x0;
      if (bVar9) break;
      bVar10 = lVar3 != 1;
      lVar3 = in_R9;
    } while (bVar10);
    puVar6 = (uchar *)*psVar8;
  }
  pp_Var2 = (_func_int **)fds.size_;
  if (bVar9) {
    pAVar1 = (((AsyncPipe *)data.ptr)->state).ptr;
    if (pAVar1 != (AsyncCapabilityStream *)0x0) {
      (*(pAVar1->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[0xe])
                (this,pAVar1,puVar6,pAVar5,psVar7);
      return (PromiseBase)(PromiseBase)this;
    }
    pvVar4 = operator_new(0x400);
    *(undefined8 *)((long)pvVar4 + 0x1d8) = 0;
    *(undefined8 *)((long)pvVar4 + 0x1e0) = 0;
    *(undefined ***)((long)pvVar4 + 0x1d0) = &PTR_destroy_0070b020;
    *(undefined ***)((long)pvVar4 + 0x1e8) = &PTR_reject_0070b070;
    *(undefined1 *)((long)pvVar4 + 0x1f0) = 0;
    *(undefined1 *)((long)pvVar4 + 0x388) = 0;
    *(undefined1 *)((long)pvVar4 + 0x390) = 1;
    local_58._0_4_ = 1;
    local_58._8_8_ = fds.ptr;
    morePieces.size_._0_4_ = (int)in_R9;
    morePieces.ptr = (ArrayPtr<const_unsigned_char> *)psVar7;
    morePieces.size_._4_4_ = (int)((ulong)in_R9 >> 0x20);
    writeBuffer.size_ = (size_t)pAVar5;
    writeBuffer.ptr = puVar6;
    pcStack_48 = (char *)pp_Var2;
    BlockedWrite::BlockedWrite
              ((BlockedWrite *)((long)pvVar4 + 0x398),
               (PromiseFulfiller<void> *)((long)pvVar4 + 0x1e8),(AsyncPipe *)data.ptr,writeBuffer,
               morePieces,
               (OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
                *)local_58);
    OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
    ::destroy((OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
               *)local_58);
    *(void **)((long)pvVar4 + 0x1d8) = pvVar4;
    local_58._0_8_ = (_func_int **)((long)pvVar4 + 0x1d0);
  }
  else {
    local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
    pcStack_48 = " == ";
    local_40 = 5;
    local_38 = pp_Var2 == (_func_int **)0x0;
    local_58._0_8_ = pp_Var2;
    if (!local_38) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[34]>
                (&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x151,FAILED,"fds.size() == 0",
                 "_kjCondition,\"can\'t attach FDs to empty message\"",
                 (DebugComparison<unsigned_long,_int> *)local_58,
                 (char (*) [34])"can\'t attach FDs to empty message");
      kj::_::Debug::Fault::fatal(&local_60);
    }
    kj::_::readyNow();
  }
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)local_58._0_8_;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> writeWithFds(ArrayPtr<const byte> data,
                             ArrayPtr<const ArrayPtr<const byte>> moreData,
                             ArrayPtr<const int> fds) override {
    while (data.size() == 0 && moreData.size() > 0) {
      data = moreData.front();
      moreData = moreData.slice(1, moreData.size());
    }

    if (data.size() == 0) {
      KJ_REQUIRE(fds.size() == 0, "can't attach FDs to empty message");
      return READY_NOW;
    } else KJ_IF_SOME(s, state) {
      return s.writeWithFds(data, moreData, fds);
    } else {
      return newAdaptedPromise<void, BlockedWrite>(*this, data, moreData, fds);
    }
  }